

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O0

char * cppcms::http::protocol::tocken<char_const*>(char *begin,char *end)

{
  char c_00;
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  char c;
  byte local_12;
  char *local_8;
  
  local_8 = in_RDI;
  while( true ) {
    local_12 = 0;
    if (local_8 < in_RSI) {
      c_00 = *local_8;
      local_12 = 0;
      if (('\x1f' < c_00) && (local_12 = 0, c_00 < '\x7f')) {
        bVar1 = separator(c_00);
        local_12 = bVar1 ^ 0xff;
      }
    }
    if ((local_12 & 1) == 0) break;
    local_8 = local_8 + 1;
  }
  return local_8;
}

Assistant:

It tocken(It begin,It end)
	{
		char c;
		while(begin < end && 0x20<=(c=*begin) && c<=0x7E && !separator(c))
			begin++;
		return begin;
	}